

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::dht_put_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_put_alert *this)

{
  uint uVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  size_t sVar4;
  difference_type in_RCX;
  span<const_char> in;
  span<const_char> in_00;
  span<const_char> in_01;
  string local_588;
  string local_568;
  char msg [1299];
  
  bVar3 = digest32<160L>::is_all_zeros(&this->target);
  uVar1 = this->num_success;
  if (bVar3) {
    in.m_len = in_RCX;
    in.m_ptr = (char *)0x20;
    aux::to_hex_abi_cxx11_(&local_588,(aux *)&this->public_key,in);
    _Var2._M_p = local_588._M_dataplus._M_p;
    in_00.m_len = in_RCX;
    in_00.m_ptr = (char *)0x40;
    aux::to_hex_abi_cxx11_(&local_568,(aux *)&this->signature,in_00);
    snprintf(msg,0x513,"DHT put complete (success=%d key=%s sig=%s salt=%s seq=%ld)",(ulong)uVar1,
             _Var2._M_p,local_568._M_dataplus._M_p,(this->salt)._M_dataplus._M_p,this->seq);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    in_01.m_len = in_RCX;
    in_01.m_ptr = (char *)0x14;
    aux::to_hex_abi_cxx11_(&local_588,(aux *)&this->target,in_01);
    snprintf(msg,0x513,"DHT put commplete (success=%d hash=%s)",(ulong)uVar1,
             local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(msg);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,msg,msg + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_put_alert::message() const
	{
		char msg[MAX_DHT_MUTABLE_DATA_LENGTH + 50];
		if (target.is_all_zeros())
		{
			std::snprintf(msg, sizeof(msg), "DHT put complete (success=%d key=%s sig=%s salt=%s seq=%" PRId64 ")"
				, num_success
				, aux::to_hex(public_key).c_str()
				, aux::to_hex(signature).c_str()
				, salt.c_str()
				, seq);
			return msg;
		}

		std::snprintf(msg, sizeof(msg), "DHT put commplete (success=%d hash=%s)"
			, num_success
			, aux::to_hex(target).c_str());
		return msg;
	}